

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O1

int uECC_valid_public_key(uint8_t *public_key)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  bool bVar7;
  uECC_word_t local_98;
  uECC_word_t tmp1 [4];
  uECC_word_t tmp2 [4];
  EccPoint public;
  
  vli_bytesToNative(tmp2 + 3,public_key);
  vli_bytesToNative(public.x + 3,public_key + 0x20);
  lVar5 = 0;
  do {
    lVar2 = lVar5 + 3;
    if (tmp2[lVar2] != 0) break;
    bVar7 = lVar5 != 3;
    lVar5 = lVar5 + 1;
  } while (bVar7);
  if (tmp2[lVar2] == 0) {
    lVar5 = 0;
    do {
      if (public.x[lVar5 + 3] != 0) goto LAB_001040b5;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
  }
  else {
LAB_001040b5:
    uVar6 = 3;
    do {
      uVar4 = curve_p[uVar6];
      uVar1 = tmp2[(ulong)uVar6 + 3];
      if (uVar1 < uVar4) goto LAB_001040e0;
      bVar7 = uVar6 != 0;
      uVar6 = uVar6 - 1;
    } while ((bVar7) && (uVar1 <= uVar4));
    if (uVar1 < uVar4) {
LAB_001040e0:
      uVar6 = 3;
      do {
        uVar4 = curve_p[uVar6];
        uVar1 = public.x[(ulong)uVar6 + 3];
        if (uVar1 < uVar4) goto LAB_00104104;
        bVar7 = uVar6 != 0;
        uVar6 = uVar6 - 1;
      } while ((bVar7) && (uVar1 <= uVar4));
      if (uVar1 < uVar4) {
LAB_00104104:
        vli_modSquare_fast(&local_98,public.x + 3);
        curve_x_side(tmp1 + 3,tmp2 + 3);
        uVar4 = 3;
        while (iVar3 = (int)uVar4, tmp1[uVar4 - 1] == tmp1[uVar4 + 3]) {
          uVar4 = (ulong)(iVar3 - 1);
          if (iVar3 == 0) {
            return 1;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int uECC_valid_public_key(const uint8_t public_key[uECC_BYTES*2]) {
    uECC_word_t tmp1[uECC_WORDS];
    uECC_word_t tmp2[uECC_WORDS];
    EccPoint public;

    vli_bytesToNative(public.x, public_key);
    vli_bytesToNative(public.y, public_key + uECC_BYTES);

    // The point at infinity is invalid.
    if (EccPoint_isZero(&public)) {
        return 0;
    }

    // x and y must be smaller than p.
    if (vli_cmp(curve_p, public.x) != 1 || vli_cmp(curve_p, public.y) != 1) {
        return 0;
    }

    vli_modSquare_fast(tmp1, public.y); /* tmp1 = y^2 */
    curve_x_side(tmp2, public.x); /* tmp2 = x^3 + ax + b */

    /* Make sure that y^2 == x^3 + ax + b */
    return (vli_cmp(tmp1, tmp2) == 0);
}